

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::setDrawType(Vbo *this,GLenum _drawType)

{
  ostream *this_00;
  GLenum _drawType_local;
  Vbo *this_local;
  
  if (((_drawType == 0x88e0) || (_drawType == 0x88e4)) || (_drawType == 0x88e8)) {
    this->m_drawType = _drawType;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Invalid draw type for mesh! Defaulting to GL_STATIC_DRAW");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->m_drawType = 0x88e4;
  }
  return;
}

Assistant:

void Vbo::setDrawType(GLenum _drawType) {
    switch (_drawType) {
        case GL_STREAM_DRAW:
        case GL_STATIC_DRAW:
        case GL_DYNAMIC_DRAW:
            m_drawType = _drawType;
            break;
        default:
            std::cout << "Invalid draw type for mesh! Defaulting to GL_STATIC_DRAW" << std::endl;
            m_drawType = GL_STATIC_DRAW;
    }
}